

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_MergeFromEmptyStringFieldTest_Test::
~NoFieldPresenceTest_MergeFromEmptyStringFieldTest_Test
          (NoFieldPresenceTest_MergeFromEmptyStringFieldTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, MergeFromEmptyStringFieldTest) {
  // As an optimization, we maintain a default string in memory and messages
  // with uninitialized fields will be constructed with a pointer to this
  // default string object. The destructor should clear the field only when it
  // is "set" to a nondefault object.
  TestAllTypes src, dst;

  // set one field to zero.
  src.set_optional_string("");
  dst.MergeFrom(src);

  dst.Clear();
}